

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcExact.c
# Opt level: O3

void Ses_ManPrintRuntime(Ses_Man_t *pSes)

{
  int level;
  double dVar1;
  double dVar2;
  
  level = 0x985d8b;
  puts("Runtime breakdown:");
  Abc_Print(level,"%s =","Sat     ");
  dVar1 = 0.0;
  if (pSes->timeTotal != 0) {
    dVar1 = ((double)pSes->timeSat * 100.0) / (double)pSes->timeTotal;
  }
  Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)pSes->timeSat / 1000000.0,dVar1);
  Abc_Print(level,"%s ="," Sat    ");
  dVar1 = 0.0;
  if (pSes->timeTotal != 0) {
    dVar1 = ((double)pSes->timeSatSat * 100.0) / (double)pSes->timeTotal;
  }
  Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)pSes->timeSatSat / 1000000.0,dVar1);
  Abc_Print(level,"%s ="," Unsat  ");
  dVar1 = 0.0;
  if (pSes->timeTotal != 0) {
    dVar1 = ((double)pSes->timeSatUnsat * 100.0) / (double)pSes->timeTotal;
  }
  Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)pSes->timeSatUnsat / 1000000.0,dVar1);
  Abc_Print(level,"%s ="," Undef  ");
  dVar1 = 0.0;
  if (pSes->timeTotal != 0) {
    dVar1 = ((double)pSes->timeSatUndef * 100.0) / (double)pSes->timeTotal;
  }
  Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)pSes->timeSatUndef / 1000000.0,dVar1);
  Abc_Print(level,"%s =","Instance");
  dVar1 = 0.0;
  if (pSes->timeTotal != 0) {
    dVar1 = ((double)pSes->timeInstance * 100.0) / (double)pSes->timeTotal;
  }
  Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)pSes->timeInstance / 1000000.0,dVar1);
  Abc_Print(level,"%s =","ALL     ");
  dVar1 = (double)pSes->timeTotal;
  dVar2 = 0.0;
  if (pSes->timeTotal != 0) {
    dVar2 = (dVar1 * 100.0) / dVar1;
  }
  Abc_Print(level,"%9.2f sec (%6.2f %%)\n",dVar1 / 1000000.0,dVar2);
  return;
}

Assistant:

static void Ses_ManPrintRuntime( Ses_Man_t * pSes )
{
    printf( "Runtime breakdown:\n" );
    ABC_PRTP( "Sat     ",  pSes->timeSat,      pSes->timeTotal );
    ABC_PRTP( " Sat    ",  pSes->timeSatSat,   pSes->timeTotal );
    ABC_PRTP( " Unsat  ",  pSes->timeSatUnsat, pSes->timeTotal );
    ABC_PRTP( " Undef  ",  pSes->timeSatUndef, pSes->timeTotal );
    ABC_PRTP( "Instance", pSes->timeInstance,  pSes->timeTotal );
    ABC_PRTP( "ALL     ",  pSes->timeTotal,    pSes->timeTotal );
}